

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          long begin,long *end,long param_5)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long uVar6;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var7;
  ulong uVar8;
  ulong uVar9;
  size_type __n;
  pointer puVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  pVar19;
  int rank;
  allocator_type local_61;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  value_type_conflict1 local_58;
  long local_50;
  long local_48;
  long *local_40;
  ulong local_38;
  
  __n = (size_type)*(int *)(param_5 + 0x10);
  local_50 = param_5;
  local_40 = end;
  if (end[1] - *end >> 3 != __n - 1) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_58);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_58 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
           ,0xc3,"split","splitters.size() == (size_t)comm.size() - 1");
    fflush(_stdout);
    param_5 = local_50;
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    __n = (size_type)*(int *)(param_5 + 0x10);
  }
  local_58 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__n,&local_58,&local_61);
  uVar13 = begin - (long)this >> 3;
  uVar12 = *(uint *)(param_5 + 0x10);
  lVar5 = *local_40;
  if (local_40[1] - lVar5 == 0) {
    puVar10 = (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar9 = uVar13;
  }
  else {
    uVar11 = local_40[1] - lVar5 >> 3;
    uVar9 = 0;
    local_60 = __return_storage_ptr__;
    local_48 = begin;
    local_38 = uVar13;
    do {
      piVar1 = (int *)(lVar5 + uVar9 * 8);
      uVar18 = uVar9 + 1;
      uVar16 = 1;
      if (uVar18 < uVar11) {
        iVar2 = *piVar1;
        uVar17 = 1;
        do {
          uVar16 = (uint)uVar17;
          iVar3 = *(int *)(lVar5 + uVar18 * 8);
          if ((iVar2 < iVar3) ||
             ((iVar2 <= iVar3 && (piVar1[1] < *(int *)(lVar5 + 4 + uVar18 * 8))))) break;
          uVar16 = uVar16 + 1;
          uVar17 = (ulong)uVar16;
          uVar18 = uVar9 + uVar17;
        } while (uVar18 < uVar11);
      }
      pVar19 = std::
               __equal_range<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_val<std::less<std::pair<int,int>>>,__gnu_cxx::__ops::_Val_comp_iter<std::less<std::pair<int,int>>>>
                         (this,local_48);
      _Var7 = pVar19.second._M_current;
      puVar10 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)pVar19.first._M_current._M_current - (long)this >> 3) + puVar10[uVar9];
      puVar10[uVar9] = uVar6;
      uVar11 = (long)_Var7._M_current - (long)pVar19.first._M_current >> 3;
      if (uVar16 != 0) {
        uVar17 = (uVar6 + uVar11) / (ulong)(uVar16 + 1) + 1;
        uVar8 = (ulong)uVar16;
        do {
          uVar4 = puVar10[uVar9];
          uVar14 = uVar13 / uVar12 + (ulong)((uVar9 & 0xffffffff) < uVar13 % (ulong)uVar12);
          uVar15 = uVar14 - uVar4;
          if (uVar14 < uVar4 || uVar15 == 0) {
            uVar15 = 0;
          }
          else {
            if (uVar15 <= uVar17) {
              uVar15 = uVar17;
            }
            if (uVar11 < uVar15) {
              uVar15 = uVar11;
            }
            uVar11 = uVar11 - uVar15;
          }
          puVar10[uVar9] = uVar15 + uVar4;
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      puVar10[uVar18] = puVar10[uVar18] + uVar11;
      lVar5 = *local_40;
      uVar11 = local_40[1] - lVar5 >> 3;
      uVar9 = uVar18;
      this = (impl *)_Var7._M_current;
    } while (uVar18 < uVar11);
    uVar12 = *(uint *)(local_50 + 0x10);
    uVar13 = local_48 - (long)_Var7._M_current >> 3;
    __return_storage_ptr__ = local_60;
    uVar9 = local_38;
  }
  puVar10[(long)(int)uVar12 + -1] = puVar10[(long)(int)uVar12 + -1] + uVar13;
  uVar13 = 0;
  for (; puVar10 !=
         (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
    uVar13 = uVar13 + *puVar10;
  }
  if (uVar13 != uVar9) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_58);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",local_58 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
           ,0xec,"split",
           "std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size"
          );
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    blk_dist local_part(local_size, comm.size(), comm.rank());
    for (size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size);
    return send_counts;
}